

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qtabwidget.cpp
# Opt level: O0

void QTabWidget::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  QSize *pQVar1;
  bool bVar2;
  TabPosition TVar3;
  TabShape TVar4;
  int iVar5;
  TextElideMode TVar6;
  QMetaType QVar7;
  ulong uVar8;
  QSize QVar9;
  QTabWidget *this;
  QtMocHelpers *in_RCX;
  uint in_EDX;
  int in_ESI;
  long in_FS_OFFSET;
  void *_v_1;
  void *_v;
  QTabWidget *_t;
  undefined4 in_stack_ffffffffffffff48;
  TabShape in_stack_ffffffffffffff4c;
  QTabWidget *in_stack_ffffffffffffff50;
  QWidget *in_stack_ffffffffffffff58;
  undefined1 enabled;
  QTabWidget *in_stack_ffffffffffffff60;
  QMetaType local_18;
  QMetaType local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_ESI == 0) {
    in_stack_ffffffffffffff60 = (QTabWidget *)(ulong)in_EDX;
    switch(in_stack_ffffffffffffff60) {
    case (QTabWidget *)0x0:
      currentChanged((QTabWidget *)0x6e8f73,in_stack_ffffffffffffff4c);
      break;
    case (QTabWidget *)0x1:
      tabCloseRequested((QTabWidget *)0x6e8f8a,in_stack_ffffffffffffff4c);
      break;
    case (QTabWidget *)0x2:
      tabBarClicked((QTabWidget *)0x6e8fa1,in_stack_ffffffffffffff4c);
      break;
    case (QTabWidget *)0x3:
      tabBarDoubleClicked((QTabWidget *)0x6e8fb8,in_stack_ffffffffffffff4c);
      break;
    case (QTabWidget *)0x4:
      setCurrentIndex(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
      break;
    case (QTabWidget *)0x5:
      setCurrentWidget(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    }
  }
  enabled = (undefined1)((ulong)in_stack_ffffffffffffff58 >> 0x38);
  if (in_ESI == 7) {
    if (in_EDX == 5) {
      if (**(int **)(in_RCX + 8) == 0) {
        QVar7 = QMetaType::fromType<QWidget*>();
        **(undefined8 **)in_RCX = QVar7.d_ptr;
      }
      else {
        memset(&local_18,0,8);
        QMetaType::QMetaType(&local_18);
        **(undefined8 **)in_RCX = local_18.d_ptr;
      }
    }
    else {
      memset(&local_10,0,8);
      QMetaType::QMetaType(&local_10);
      **(undefined8 **)in_RCX = local_10.d_ptr;
    }
  }
  if ((in_ESI != 5) ||
     ((((bVar2 = QtMocHelpers::indexOfMethod<void(QTabWidget::*)(int)>
                           (in_RCX,(void **)currentChanged,0,0), !bVar2 &&
        (bVar2 = QtMocHelpers::indexOfMethod<void(QTabWidget::*)(int)>
                           (in_RCX,(void **)tabCloseRequested,0,1), !bVar2)) &&
       (bVar2 = QtMocHelpers::indexOfMethod<void(QTabWidget::*)(int)>
                          (in_RCX,(void **)tabBarClicked,0,2), !bVar2)) &&
      (bVar2 = QtMocHelpers::indexOfMethod<void(QTabWidget::*)(int)>
                         (in_RCX,(void **)tabBarDoubleClicked,0,3), !bVar2)))) {
    if (in_ESI == 1) {
      pQVar1 = *(QSize **)in_RCX;
      uVar8 = (ulong)in_EDX;
      switch(uVar8) {
      case 0:
        TVar3 = tabPosition(in_stack_ffffffffffffff50);
        (pQVar1->wd).m_i = TVar3;
        break;
      case 1:
        TVar4 = tabShape(in_stack_ffffffffffffff50);
        (pQVar1->wd).m_i = TVar4;
        break;
      case 2:
        iVar5 = currentIndex(in_stack_ffffffffffffff50);
        (pQVar1->wd).m_i = iVar5;
        break;
      case 3:
        iVar5 = count(in_stack_ffffffffffffff50);
        (pQVar1->wd).m_i = iVar5;
        break;
      case 4:
        QVar9 = iconSize((QTabWidget *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48)
                        );
        *pQVar1 = QVar9;
        break;
      case 5:
        TVar6 = elideMode((QTabWidget *)0x6e9273);
        (pQVar1->wd).m_i = TVar6;
        break;
      case 6:
        bVar2 = usesScrollButtons((QTabWidget *)0x6e9288);
        *(bool *)&(pQVar1->wd).m_i = bVar2;
        break;
      case 7:
        bVar2 = documentMode(in_stack_ffffffffffffff50);
        *(bool *)&(pQVar1->wd).m_i = bVar2;
        break;
      case 8:
        bVar2 = tabsClosable((QTabWidget *)0x6e92b8);
        *(bool *)&(pQVar1->wd).m_i = bVar2;
        break;
      case 9:
        bVar2 = isMovable((QTabWidget *)0x6e92d0);
        *(bool *)&(pQVar1->wd).m_i = bVar2;
        break;
      case 10:
        bVar2 = tabBarAutoHide(in_stack_ffffffffffffff50);
        *(bool *)&(pQVar1->wd).m_i = bVar2;
      }
      enabled = (undefined1)(uVar8 >> 0x38);
    }
    if (in_ESI == 2) {
      this = (QTabWidget *)(ulong)in_EDX;
      bVar2 = SUB41(in_stack_ffffffffffffff4c >> 0x18,0);
      switch(this) {
      case (QTabWidget *)0x0:
        setTabPosition(this,in_stack_ffffffffffffff4c);
        break;
      case (QTabWidget *)0x1:
        setTabShape(this,in_stack_ffffffffffffff4c);
        break;
      case (QTabWidget *)0x2:
        setCurrentIndex(this,in_stack_ffffffffffffff4c);
        break;
      default:
        break;
      case (QTabWidget *)0x4:
        setIconSize(this,(QSize *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
        break;
      case (QTabWidget *)0x5:
        setElideMode(this,in_stack_ffffffffffffff4c);
        break;
      case (QTabWidget *)0x6:
        setUsesScrollButtons(this,bVar2);
        break;
      case (QTabWidget *)0x7:
        setDocumentMode(in_stack_ffffffffffffff60,(bool)enabled);
        break;
      case (QTabWidget *)0x8:
        setTabsClosable(this,bVar2);
        break;
      case (QTabWidget *)0x9:
        setMovable(this,bVar2);
        break;
      case (QTabWidget *)0xa:
        setTabBarAutoHide(this,bVar2);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTabWidget::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QTabWidget *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->currentChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 1: _t->tabCloseRequested((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 2: _t->tabBarClicked((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 3: _t->tabBarDoubleClicked((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 4: _t->setCurrentIndex((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 5: _t->setCurrentWidget((*reinterpret_cast< std::add_pointer_t<QWidget*>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        switch (_id) {
        default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
        case 5:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QWidget* >(); break;
            }
            break;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QTabWidget::*)(int )>(_a, &QTabWidget::currentChanged, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTabWidget::*)(int )>(_a, &QTabWidget::tabCloseRequested, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTabWidget::*)(int )>(_a, &QTabWidget::tabBarClicked, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTabWidget::*)(int )>(_a, &QTabWidget::tabBarDoubleClicked, 3))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<TabPosition*>(_v) = _t->tabPosition(); break;
        case 1: *reinterpret_cast<TabShape*>(_v) = _t->tabShape(); break;
        case 2: *reinterpret_cast<int*>(_v) = _t->currentIndex(); break;
        case 3: *reinterpret_cast<int*>(_v) = _t->count(); break;
        case 4: *reinterpret_cast<QSize*>(_v) = _t->iconSize(); break;
        case 5: *reinterpret_cast<Qt::TextElideMode*>(_v) = _t->elideMode(); break;
        case 6: *reinterpret_cast<bool*>(_v) = _t->usesScrollButtons(); break;
        case 7: *reinterpret_cast<bool*>(_v) = _t->documentMode(); break;
        case 8: *reinterpret_cast<bool*>(_v) = _t->tabsClosable(); break;
        case 9: *reinterpret_cast<bool*>(_v) = _t->isMovable(); break;
        case 10: *reinterpret_cast<bool*>(_v) = _t->tabBarAutoHide(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setTabPosition(*reinterpret_cast<TabPosition*>(_v)); break;
        case 1: _t->setTabShape(*reinterpret_cast<TabShape*>(_v)); break;
        case 2: _t->setCurrentIndex(*reinterpret_cast<int*>(_v)); break;
        case 4: _t->setIconSize(*reinterpret_cast<QSize*>(_v)); break;
        case 5: _t->setElideMode(*reinterpret_cast<Qt::TextElideMode*>(_v)); break;
        case 6: _t->setUsesScrollButtons(*reinterpret_cast<bool*>(_v)); break;
        case 7: _t->setDocumentMode(*reinterpret_cast<bool*>(_v)); break;
        case 8: _t->setTabsClosable(*reinterpret_cast<bool*>(_v)); break;
        case 9: _t->setMovable(*reinterpret_cast<bool*>(_v)); break;
        case 10: _t->setTabBarAutoHide(*reinterpret_cast<bool*>(_v)); break;
        default: break;
        }
    }
}